

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O3

void __thiscall shared_ptr_stat_pointer_cast_Test::TestBody(shared_ptr_stat_pointer_cast_Test *this)

{
  B *pBVar1;
  shared_ptr_base sVar2;
  A *p;
  bool bVar3;
  A *pAVar4;
  AssertHelperData *pAVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  long in_FS_OFFSET;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  shared_ptr<A> local_98;
  AssertHelper local_88;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  shared_ptr<A> local_68;
  shared_ptr<B> local_58;
  shared_ptr<A> local_48;
  shared_ptr<A> local_38;
  shared_ptr<A> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_28.px = (A *)0x0;
  local_48.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_48.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_38,"false","a0Ptr",(bool *)&local_48,&local_28);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x215,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar4 = (A *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  pAVar4->_vptr_A = (_func_int **)&PTR__A_00187f50;
  local_38.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<A>((shared_ptr_count *)&local_38,pAVar4);
  local_58.super_shared_ptr_base.pn.pn._0_1_ = 1;
  local_38.px = pAVar4;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_48,"true","aPtr",(bool *)&local_58,&local_38);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x219,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_38.super_shared_ptr_base.pn.pn == 1;
  }
  local_68.super_shared_ptr_base.pn.pn._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_48,"true","aPtr.unique()",(bool *)&local_58,(bool *)&local_68);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21a,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_4_ = 1;
  if (local_38.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_58.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_38.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_48,"1","aPtr.use_count()",(int *)&local_68,(long *)&local_58);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21b,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_38.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_48,"(void*)__null","aPtr.get()",(void **)&local_58,(A **)&local_68);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21c,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_48,"1","A::_mNbInstances",(int *)&local_58,&A::_mNbInstances);
  if ((char)local_48.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (local_48.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_48.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x21d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_58.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_58.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar5 = (AssertHelperData *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  B::_mNbInstances = B::_mNbInstances + 1;
  *(undefined ***)pAVar5 = &PTR__B_00187f08;
  local_48.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<A>((shared_ptr_count *)&local_48,(A *)pAVar5);
  local_68.super_shared_ptr_base.pn.pn._0_1_ = 1;
  local_48.px = (A *)pAVar5;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_58,"true","abPtr",(bool *)&local_68,&local_48);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = ((local_58.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x220,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_48.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_48.super_shared_ptr_base.pn.pn == 1;
  }
  local_80.data_._0_1_ = (internal)bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_58,"true","abPtr.unique()",(bool *)&local_68,(bool *)&local_80);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = ((local_58.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x221,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 1;
  if (local_48.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_68.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_48.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_58,"1","abPtr.use_count()",(int *)&local_80,(long *)&local_68);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = ((local_58.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x222,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_80.data_ = (AssertHelperData *)local_48.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_58,"(void*)__null","abPtr.get()",(void **)&local_68,(A **)&local_80)
  ;
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = ((local_58.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x223,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"2","A::_mNbInstances",(int *)&local_68,&A::_mNbInstances);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = ((local_58.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x224,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"1","B::_mNbInstances",(int *)&local_68,&B::_mNbInstances);
  if ((char)local_58.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_58.px == (B *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = ((local_58.px)->super_A)._vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x225,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_68.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar5 = (AssertHelperData *)operator_new(8);
  A::_mNbInstances = A::_mNbInstances + 1;
  B::_mNbInstances = B::_mNbInstances + 1;
  *(undefined ***)pAVar5 = &PTR__B_00187f08;
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  shared_ptr_count::acquire<B>((shared_ptr_count *)&local_58,(B *)pAVar5);
  local_80.data_._0_1_ = (internal)0x1;
  local_58.px = (B *)pAVar5;
  testing::internal::CmpHelperEQ<bool,shared_ptr<B>>
            ((internal *)&local_68,"true","bPtr",(bool *)&local_80,&local_58);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_68.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x228,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_1_ = (internal)0x1;
  if (local_58.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_58.super_shared_ptr_base.pn.pn == 1;
  }
  local_70.data_._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_68,"true","bPtr.unique()",(bool *)&local_80,(bool *)&local_70);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_68.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x229,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_._0_4_ = 1;
  if (local_58.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_80.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_80.data_ = *(AssertHelperData **)local_58.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_68,"1","bPtr.use_count()",(int *)&local_70,(long *)&local_80);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_68.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22a,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_ = (AssertHelperData *)0x0;
  local_70.data_ = (AssertHelperData *)local_58.px;
  testing::internal::CmpHelperNE<void*,B*>
            ((internal *)&local_68,"(void*)__null","bPtr.get()",&local_80.data_,(B **)&local_70);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_68.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22b,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"3","A::_mNbInstances",(int *)&local_80,&A::_mNbInstances);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_68.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22c,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"2","B::_mNbInstances",(int *)&local_80,&B::_mNbInstances);
  if ((char)local_68.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_68.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_68.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x22d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar1 = local_58.px;
  local_68.super_shared_ptr_base.pn.pn = local_58.super_shared_ptr_base.pn.pn;
  shared_ptr_count::acquire<A>((shared_ptr_count *)&local_68,&(local_58.px)->super_A);
  local_68.px = &pBVar1->super_A;
  local_70.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_80,"true","a2Ptr",(bool *)&local_70,&local_68);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x231,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_ = local_70.data_ & 0xffffffffffffff00;
  if (local_68.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_68.super_shared_ptr_base.pn.pn == 1;
  }
  local_88.data_._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_80,"false","a2Ptr.unique()",(bool *)&local_70,(bool *)&local_88);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x232,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.data_._0_4_ = 2;
  if (local_68.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_70.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_70.data_ = *(AssertHelperData **)local_68.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_80,"2","a2Ptr.use_count()",(int *)&local_88,(long *)&local_70);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x233,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_ = (AssertHelperData *)0x0;
  local_88.data_ = (AssertHelperData *)local_68.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_80,"(void*)__null","a2Ptr.get()",&local_70.data_,(A **)&local_88);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x234,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"3","A::_mNbInstances",(int *)&local_70,&A::_mNbInstances);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x235,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"2","B::_mNbInstances",(int *)&local_70,&B::_mNbInstances);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x236,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr<A>::shared_ptr(&local_98,&local_68);
  p = local_28.px;
  sVar2.pn.pn = local_28.super_shared_ptr_base.pn.pn;
  pAVar4 = local_98.px;
  local_98.px = local_28.px;
  local_28.super_shared_ptr_base.pn.pn = local_98.super_shared_ptr_base.pn.pn;
  local_28.px = pAVar4;
  local_98.super_shared_ptr_base.pn.pn = sVar2.pn.pn;
  shared_ptr_count::release<A>((shared_ptr_count *)&local_98,p);
  local_98.px = (A *)0x0;
  local_88.data_._0_4_ = 3;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_70.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_70.data_ = *(AssertHelperData **)local_28.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_80,"3","a0Ptr.use_count()",(int *)&local_88,(long *)&local_70);
  if (local_80.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_68,local_68.px);
  shared_ptr_count::release<B>((shared_ptr_count *)&local_58,local_58.px);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_48,local_48.px);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_38,local_38.px);
  local_48.super_shared_ptr_base.pn.pn._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_38,"true","a0Ptr",(bool *)&local_48,&local_28);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23d,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
  }
  local_58.super_shared_ptr_base.pn.pn._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"true","a0Ptr.unique()",(bool *)&local_48,(bool *)&local_58);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23e,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn._0_4_ = 1;
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_48.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_48.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_28.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_38,"1","a0Ptr.use_count()",(int *)&local_58,(long *)&local_48);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x23f,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_28.px;
  testing::internal::CmpHelperNE<void*,A*>
            ((internal *)&local_38,"(void*)__null","a0Ptr.get()",(void **)&local_48,(A **)&local_58)
  ;
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x240,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"1","A::_mNbInstances",(int *)&local_48,&A::_mNbInstances);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x241,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"1","B::_mNbInstances",(int *)&local_48,&B::_mNbInstances);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x242,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_28,local_28.px);
  local_28.px = (A *)0x0;
  local_48.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_48.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,shared_ptr<A>>
            ((internal *)&local_38,"false","a0Ptr",(bool *)&local_48,&local_28);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x246,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_48.super_shared_ptr_base.pn.pn & 0xffffffffffffff00);
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = *(long *)local_28.super_shared_ptr_base.pn.pn == 1;
  }
  local_58.super_shared_ptr_base.pn.pn._0_1_ = bVar3;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"false","a0Ptr.unique()",(bool *)&local_48,(bool *)&local_58);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x247,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_58.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  if (local_28.super_shared_ptr_base.pn.pn == (long *)0x0) {
    local_48.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    local_48.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)local_28.super_shared_ptr_base.pn.pn
    ;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_38,"0","a0Ptr.use_count()",(int *)&local_58,(long *)&local_48);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x248,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_58.super_shared_ptr_base.pn.pn = (shared_ptr_count)(shared_ptr_count)local_28.px;
  testing::internal::CmpHelperEQ<void*,A*>
            ((internal *)&local_38,"(void*)__null","a0Ptr.get()",(void **)&local_48,(A **)&local_58)
  ;
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x249,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_48.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"0","A::_mNbInstances",(int *)&local_48,&A::_mNbInstances);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24a,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_shared_ptr_base.pn.pn =
       (shared_ptr_count)((ulong)local_48.super_shared_ptr_base.pn.pn & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"0","B::_mNbInstances",(int *)&local_48,&B::_mNbInstances);
  if ((char)local_38.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.px == (A *)0x0) {
      pp_Var7 = (_func_int **)0x1706de;
    }
    else {
      pp_Var7 = (local_38.px)->_vptr_A;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x24b,(char *)pp_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_48.super_shared_ptr_base.pn.pn != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_48.super_shared_ptr_base.pn.pn != (long *)0x0)) {
        (**(code **)(*(long *)local_48.super_shared_ptr_base.pn.pn + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.px,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  shared_ptr_count::release<A>((shared_ptr_count *)&local_28,local_28.px);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, stat_pointer_cast)
{
   shared_ptr<A> a0Ptr;
   EXPECT_EQ(false, a0Ptr);

   {
      shared_ptr<A> aPtr(new A);
      EXPECT_EQ(true, aPtr);
      EXPECT_EQ(true, aPtr.unique());
      EXPECT_EQ(1, aPtr.use_count());
      EXPECT_NE((void*)NULL, aPtr.get());
      EXPECT_EQ(1, A::_mNbInstances);

      shared_ptr<A> abPtr(new B);
      EXPECT_EQ(true, abPtr);
      EXPECT_EQ(true, abPtr.unique());
      EXPECT_EQ(1, abPtr.use_count());
      EXPECT_NE((void*)NULL, abPtr.get());
      EXPECT_EQ(2, A::_mNbInstances);
      EXPECT_EQ(1, B::_mNbInstances);

      shared_ptr<B> bPtr(new B);
      EXPECT_EQ(true, bPtr);
      EXPECT_EQ(true, bPtr.unique());
      EXPECT_EQ(1, bPtr.use_count());
      EXPECT_NE((void*)NULL, bPtr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // static cast
      shared_ptr<A> a2Ptr = static_pointer_cast<A>(bPtr);
      EXPECT_EQ(true, a2Ptr);
      EXPECT_EQ(false, a2Ptr.unique());
      EXPECT_EQ(2, a2Ptr.use_count());
      EXPECT_NE((void*)NULL, a2Ptr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // memorize a2Ptr
      a0Ptr = a2Ptr;
      EXPECT_EQ(3, a0Ptr.use_count());
   }
   // after release of the aPtr and bPtr : only abPtr converted to a2Ptr survived through a0Ptr
   EXPECT_EQ(true, a0Ptr);
   EXPECT_EQ(true, a0Ptr.unique());
   EXPECT_EQ(1, a0Ptr.use_count());
   EXPECT_NE((void*)NULL, a0Ptr.get());
   EXPECT_EQ(1, A::_mNbInstances);
   EXPECT_EQ(1, B::_mNbInstances);

   // release the last one
   a0Ptr.reset();
   EXPECT_EQ(false, a0Ptr);
   EXPECT_EQ(false, a0Ptr.unique());
   EXPECT_EQ(0,     a0Ptr.use_count());
   EXPECT_EQ((void*)NULL,  a0Ptr.get());
   EXPECT_EQ(0,     A::_mNbInstances);
   EXPECT_EQ(0,     B::_mNbInstances);
}